

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O2

void MPIX_step_recv(comm_pkg *comm,int tag,MPI_Comm mpi_comm,MPI_Datatype mpi_type,
                   MPI_Request *recv_requests,char **recv_buffer_ptr)

{
  comm_data *pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int size;
  int local_4c;
  char **local_48;
  MPI_Datatype local_40;
  comm_pkg *local_38;
  
  iVar4 = comm->recv_data->size_msgs;
  iVar5 = 0;
  local_4c = tag;
  local_48 = recv_buffer_ptr;
  local_40 = mpi_type;
  local_38 = comm;
  if (iVar4 == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    MPI_Pack_size(iVar4,mpi_type,mpi_comm,&size);
    iVar4 = -1;
    if (-1 < size) {
      iVar4 = size;
    }
    pcVar2 = (char *)operator_new__((long)iVar4);
  }
  for (lVar3 = 0; pcVar1 = local_38->recv_data, lVar3 < pcVar1->num_msgs; lVar3 = lVar3 + 1) {
    iVar4 = pcVar1->procs[lVar3];
    MPI_Pack_size(pcVar1->indptr[lVar3 + 1] - pcVar1->indptr[lVar3],local_40,mpi_comm,&size);
    MPI_Irecv(pcVar2 + iVar5,size,&ompi_mpi_packed,iVar4,local_4c,mpi_comm,recv_requests);
    iVar5 = iVar5 + size;
    recv_requests = recv_requests + 1;
  }
  if (pcVar2 != (char *)0x0) {
    *local_48 = pcVar2;
  }
  return;
}

Assistant:

static void MPIX_step_recv(comm_pkg* comm,
        int tag, MPI_Comm mpi_comm, MPI_Datatype mpi_type,
        MPI_Request* recv_requests, char** recv_buffer_ptr)
{
    int proc, start, end, size;
    char* recv_buffer = NULL;
    if (comm->recv_data->size_msgs)
    {
        MPI_Pack_size(comm->recv_data->size_msgs, mpi_type, mpi_comm, &size);
        recv_buffer = new char[size];
    }

    int ctr = 0;
    for (int i = 0; i < comm->recv_data->num_msgs; i++)
    {
        proc = comm->recv_data->procs[i];
        start = comm->recv_data->indptr[i];
        end = comm->recv_data->indptr[i+1];
        MPI_Pack_size(end - start, mpi_type, mpi_comm, &size);
        MPI_Irecv(&recv_buffer[ctr], size, MPI_PACKED, proc, tag,
                mpi_comm, &recv_requests[i]);
        ctr += size;
    }

    if (recv_buffer) *recv_buffer_ptr = recv_buffer;
}